

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_ssm_scan(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  void *pvVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  void *pvVar24;
  void *pvVar25;
  undefined1 auVar26 [16];
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  char *pcVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  undefined8 uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  float fVar42;
  undefined4 uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  long local_f0;
  undefined1 extraout_var [60];
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
               ,0x1da7,"fatal error");
  }
  pgVar4 = dst->src[3];
  pgVar5 = dst->src[4];
  iVar34 = params->ith;
  iVar27 = params->nth;
  pgVar6 = dst->src[1];
  pgVar7 = dst->src[2];
  lVar31 = pgVar3->ne[1];
  pgVar8 = dst->src[5];
  lVar9 = pgVar3->ne[0];
  lVar10 = pgVar6->ne[1];
  lVar11 = pgVar3->ne[2];
  lVar28 = ggml_nelements();
  lVar29 = ggml_nelements(pgVar3);
  lVar30 = ggml_nelements(dst);
  if (lVar29 + lVar28 == lVar30) {
    if (pgVar3->nb[0] == 4) {
      if (pgVar6->nb[0] == 4) {
        if (pgVar7->nb[0] == 4) {
          if (pgVar4->nb[0] == 4) {
            if (pgVar5->nb[0] == 4) {
              if (pgVar8->nb[0] == 4) {
                if (pgVar3->nb[1] == pgVar3->ne[0] << 2) {
                  if (pgVar3->nb[2] == pgVar3->nb[1] * pgVar3->ne[1]) {
                    if (pgVar6->nb[3] == pgVar6->ne[0] * pgVar6->ne[1] * pgVar6->ne[2] * 4) {
                      if (0 < lVar11) {
                        local_f0 = 0;
                        iVar27 = (int)(((long)iVar27 + -1 + lVar31) / (long)iVar27);
                        iVar34 = iVar34 * iVar27;
                        iVar27 = iVar27 + iVar34;
                        lVar28 = (long)iVar34;
                        if (lVar31 <= iVar27) {
                          iVar27 = (int)lVar31;
                        }
                        do {
                          if (0 < lVar10) {
                            lVar31 = 0;
                            do {
                              pvVar12 = dst->data;
                              lVar30 = pgVar3->nb[1] * lVar28;
                              lVar29 = pgVar3->nb[2] * local_f0;
                              lVar38 = (long)pvVar12 + pgVar6->nb[3] + lVar29 + lVar30;
                              lVar29 = (long)pgVar3->data + lVar29 + lVar30;
                              if (lVar31 != 0) {
                                lVar29 = lVar38;
                              }
                              if (0 < iVar27 - iVar34) {
                                uVar41 = 0;
                                pvVar13 = pgVar6->data;
                                lVar30 = pgVar6->nb[0] * lVar28;
                                sVar14 = pgVar7->nb[0];
                                lVar33 = pgVar6->nb[2] * local_f0 + pgVar6->nb[1] * lVar31;
                                sVar15 = pgVar7->nb[1];
                                pvVar16 = pgVar7->data;
                                sVar17 = pgVar7->nb[2];
                                lVar36 = 0;
                                sVar18 = pgVar4->nb[1];
                                pvVar19 = pgVar4->data;
                                sVar20 = pgVar8->nb[2];
                                sVar21 = pgVar8->nb[1];
                                sVar22 = pgVar5->nb[1];
                                sVar23 = pgVar5->nb[2];
                                pvVar24 = pgVar8->data;
                                pvVar25 = pgVar5->data;
                                do {
                                  fVar42 = *(float *)((long)pvVar16 +
                                                     uVar41 * 4 +
                                                     sVar17 * local_f0 + sVar15 * lVar31 +
                                                     sVar14 * lVar28);
                                  if (fVar42 <= 20.0) {
                                    fVar42 = expf(fVar42);
                                    fVar42 = log1pf(fVar42);
                                  }
                                  if (lVar9 < 1) {
                                    uVar43 = 0;
                                  }
                                  else {
                                    fVar1 = *(float *)((long)pvVar13 + uVar41 * 4 + lVar33 + lVar30)
                                    ;
                                    lVar40 = 0;
                                    auVar44._0_12_ = ZEXT812(0);
                                    auVar44._12_4_ = 0;
                                    lVar35 = lVar36;
                                    do {
                                      lVar39 = lVar35 >> 0x1e;
                                      uVar2 = *(uint *)(lVar29 + lVar39);
                                      auVar45._0_4_ =
                                           expf(fVar42 * *(float *)((long)pvVar19 +
                                                                   lVar39 + sVar18 * lVar28));
                                      auVar45._4_60_ = extraout_var;
                                      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar42 * fVar1 *
                                                                              *(float *)((long)
                                                  pvVar25 + lVar40 * 4 +
                                                            sVar22 * lVar31 + sVar23 * local_f0))),
                                                  auVar45._0_16_,ZEXT416(uVar2));
                                      auVar44 = vfmadd231ss_fma(ZEXT416(auVar44._0_4_),auVar26,
                                                                ZEXT416(*(uint *)((long)pvVar24 +
                                                                                 lVar40 * 4 +
                                                                                 sVar21 * lVar31 +
                                                                                 sVar20 * local_f0))
                                                               );
                                      uVar43 = auVar44._0_4_;
                                      lVar40 = lVar40 + 1;
                                      *(int *)(lVar38 + lVar39) = auVar26._0_4_;
                                      lVar35 = lVar35 + 0x100000000;
                                    } while (lVar9 != lVar40);
                                  }
                                  lVar36 = lVar36 + (lVar9 << 0x20);
                                  *(undefined4 *)((long)pvVar12 + uVar41 * 4 + lVar33 + lVar30) =
                                       uVar43;
                                  uVar41 = uVar41 + 1;
                                } while (uVar41 != (uint)(iVar27 - iVar34));
                              }
                              lVar31 = lVar31 + 1;
                            } while (lVar31 != lVar10);
                          }
                          local_f0 = local_f0 + 1;
                        } while (local_f0 != lVar11);
                      }
                      return;
                    }
                    pcVar32 = "src1->nb[3] == src1->ne[0]*src1->ne[1]*src1->ne[2]*sizeof(float)";
                    uVar37 = 0x1d70;
                  }
                  else {
                    pcVar32 = "src0->nb[2] == src0->ne[0]*src0->ne[1]*sizeof(float)";
                    uVar37 = 0x1d6e;
                  }
                }
                else {
                  pcVar32 = "src0->nb[1] == src0->ne[0]*sizeof(float)";
                  uVar37 = 0x1d6c;
                }
              }
              else {
                pcVar32 = "src5->nb[0] == sizeof(float)";
                uVar37 = 0x1d6a;
              }
            }
            else {
              pcVar32 = "src4->nb[0] == sizeof(float)";
              uVar37 = 0x1d69;
            }
          }
          else {
            pcVar32 = "src3->nb[0] == sizeof(float)";
            uVar37 = 0x1d68;
          }
        }
        else {
          pcVar32 = "src2->nb[0] == sizeof(float)";
          uVar37 = 0x1d67;
        }
      }
      else {
        pcVar32 = "src1->nb[0] == sizeof(float)";
        uVar37 = 0x1d66;
      }
    }
    else {
      pcVar32 = "src0->nb[0] == sizeof(float)";
      uVar37 = 0x1d65;
    }
  }
  else {
    pcVar32 = "ggml_nelements(src1) + ggml_nelements(src0) == ggml_nelements(dst)";
    uVar37 = 0x1d64;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
             ,uVar37,"GGML_ASSERT(%s) failed",pcVar32);
}

Assistant:

void ggml_compute_forward_ssm_scan(
        const ggml_compute_params * params,
        ggml_tensor * dst) {
    switch (dst->src[0]->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_ssm_scan_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}